

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

TestCaseGroup *
vkt::pipeline::anon_unknown_0::createDefaultValueTests
          (TestContext *testCtx,VkShaderStageFlagBits shaderStage)

{
  TestCaseGroup *pTVar1;
  GenericValue value_;
  TestNode *this;
  SpecConstantTest *this_00;
  CaseDefinition *local_9e0;
  int local_78c;
  int defNdx;
  OffsetValue local_778;
  allocator<char> local_764;
  allocator<char> local_763;
  allocator<char> local_762;
  allocator<char> local_761;
  string local_760;
  SpecConstant local_740;
  allocator<char> local_705;
  undefined1 local_704;
  undefined1 local_703;
  undefined1 local_702;
  undefined1 local_701;
  deUint64 local_700;
  OffsetValue local_6f8;
  allocator<char> local_6e4;
  allocator<char> local_6e3;
  allocator<char> local_6e2;
  allocator<char> local_6e1;
  string local_6e0;
  SpecConstant local_6c0;
  allocator<char> local_685;
  undefined1 local_684;
  undefined1 local_683;
  undefined1 local_682;
  undefined1 local_681;
  deUint64 local_680;
  OffsetValue local_678;
  allocator<char> local_664;
  allocator<char> local_663;
  allocator<char> local_662;
  allocator<char> local_661;
  string local_660;
  SpecConstant local_640;
  allocator<char> local_605;
  undefined1 local_604;
  undefined1 local_603;
  undefined1 local_602;
  undefined1 local_601;
  deUint64 local_600;
  OffsetValue local_5f8;
  deUint64 local_5e8;
  OffsetValue local_5e0;
  allocator<char> local_5cc;
  allocator<char> local_5cb;
  allocator<char> local_5ca;
  allocator<char> local_5c9;
  string local_5c8;
  SpecConstant local_5a8;
  allocator<char> local_569;
  string local_568;
  SpecConstant local_548;
  allocator<char> local_50d;
  undefined1 local_50c;
  undefined1 local_50b;
  undefined1 local_50a;
  undefined1 local_509;
  deUint64 local_508;
  OffsetValue local_500;
  deUint64 local_4f0;
  OffsetValue local_4e8;
  allocator<char> local_4d4;
  allocator<char> local_4d3;
  allocator<char> local_4d2;
  allocator<char> local_4d1;
  string local_4d0;
  SpecConstant local_4b0;
  allocator<char> local_471;
  string local_470;
  SpecConstant local_450;
  allocator<char> local_411;
  string *local_410;
  undefined1 local_408 [8];
  CaseDefinition defs [5];
  DefaultDeleter<tcu::TestCaseGroup> local_3d [13];
  undefined1 local_30 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  VkShaderStageFlagBits shaderStage_local;
  TestContext *testCtx_local;
  
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _12_4_ = shaderStage;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"default_value","use default constant value");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_3d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_30,pTVar1
            );
  local_410 = (string *)local_408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_408,"bool",&local_411);
  local_50c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"layout(constant_id = ${ID}) const bool sc0 = true;",&local_471);
  SpecConstant::SpecConstant(&local_450,1,&local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"layout(constant_id = ${ID}) const bool sc1 = false;",&local_4d1);
  SpecConstant::SpecConstant(&local_4b0,2,&local_4d0);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
              *)((long)&defs[0].name.field_2 + 8),&local_450,&local_4b0);
  local_50b = 1;
  defs[0].specConstants.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[0].ssboSize,"    bool r0;\n    bool r1;\n",&local_4d2);
  local_50a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[0].ssboCode.field_2._M_local_buf + 8),"",&local_4d3);
  local_509 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[0].globalCode.field_2._M_local_buf + 8),
             "    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",&local_4d4);
  local_4f0 = (deUint64)makeValueBool32(true);
  OffsetValue::OffsetValue(&local_4e8,4,0,(GenericValue)local_4f0);
  local_508 = (deUint64)makeValueBool32(false);
  OffsetValue::OffsetValue(&local_500,4,4,(GenericValue)local_508);
  makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
            ((vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
              *)((long)&defs[0].mainCode.field_2 + 8),&local_4e8,&local_500);
  defs[0].expectedValues.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_509 = 0;
  local_50a = 0;
  local_50b = 0;
  local_50c = 0;
  local_410 = (string *)&defs[0].requirements;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[0].requirements,"int",&local_50d);
  local_604 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"layout(constant_id = ${ID}) const int sc0 = -3;",&local_569);
  SpecConstant::SpecConstant(&local_548,1,&local_568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"layout(constant_id = ${ID}) const int sc1 = 17;",&local_5c9);
  SpecConstant::SpecConstant(&local_5a8,2,&local_5c8);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
              *)((long)&defs[1].name.field_2 + 8),&local_548,&local_5a8);
  local_603 = 1;
  defs[1].specConstants.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[1].ssboSize,"    int r0;\n    int r1;\n",&local_5ca);
  local_602 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[1].ssboCode.field_2._M_local_buf + 8),"",&local_5cb);
  local_601 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[1].globalCode.field_2._M_local_buf + 8),
             "    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",&local_5cc);
  local_5e8 = (deUint64)makeValueInt32(-3);
  OffsetValue::OffsetValue(&local_5e0,4,0,(GenericValue)local_5e8);
  local_600 = (deUint64)makeValueInt32(0x11);
  OffsetValue::OffsetValue(&local_5f8,4,4,(GenericValue)local_600);
  makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
            ((vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
              *)((long)&defs[1].mainCode.field_2 + 8),&local_5e0,&local_5f8);
  defs[1].expectedValues.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_601 = 0;
  local_602 = 0;
  local_603 = 0;
  local_604 = 0;
  local_410 = (string *)&defs[1].requirements;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[1].requirements,"uint",&local_605);
  local_684 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_660,"layout(constant_id = ${ID}) const uint sc0 = 42u;",&local_661);
  SpecConstant::SpecConstant(&local_640,1,&local_660);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
              *)((long)&defs[2].name.field_2 + 8),&local_640);
  local_683 = 1;
  defs[2].specConstants.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[2].ssboSize,"    uint r0;\n",&local_662);
  local_682 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[2].ssboCode.field_2._M_local_buf + 8),"",&local_663);
  local_681 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[2].globalCode.field_2._M_local_buf + 8),"    sb_out.r0 = sc0;\n",
             &local_664);
  local_680 = (deUint64)makeValueUint32(0x2a);
  OffsetValue::OffsetValue(&local_678,4,0,(GenericValue)local_680);
  makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
            ((vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
              *)((long)&defs[2].mainCode.field_2 + 8),&local_678);
  defs[2].expectedValues.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_681 = 0;
  local_682 = 0;
  local_683 = 0;
  local_684 = 0;
  local_410 = (string *)&defs[2].requirements;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[2].requirements,"float",&local_685);
  local_704 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,"layout(constant_id = ${ID}) const float sc0 = 7.5;",&local_6e1);
  SpecConstant::SpecConstant(&local_6c0,1,&local_6e0);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
              *)((long)&defs[3].name.field_2 + 8),&local_6c0);
  local_703 = 1;
  defs[3].specConstants.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[3].ssboSize,"    float r0;\n",&local_6e2);
  local_702 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[3].ssboCode.field_2._M_local_buf + 8),"",&local_6e3);
  local_701 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[3].globalCode.field_2._M_local_buf + 8),"    sb_out.r0 = sc0;\n",
             &local_6e4);
  local_700 = (deUint64)makeValueFloat32(7.5);
  OffsetValue::OffsetValue(&local_6f8,4,0,(GenericValue)local_700);
  makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
            ((vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
              *)((long)&defs[3].mainCode.field_2 + 8),&local_6f8);
  defs[3].expectedValues.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_701 = 0;
  local_702 = 0;
  local_703 = 0;
  local_704 = 0;
  local_410 = (string *)&defs[3].requirements;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[3].requirements,"double",&local_705);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"layout(constant_id = ${ID}) const double sc0 = 2.75LF;",
             &local_761);
  SpecConstant::SpecConstant(&local_740,1,&local_760);
  makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
            ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
              *)((long)&defs[4].name.field_2 + 8),&local_740);
  defs[4].specConstants.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defs[4].ssboSize,"    double r0;\n",&local_762);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[4].ssboCode.field_2._M_local_buf + 8),"",&local_763);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(defs[4].globalCode.field_2._M_local_buf + 8),"    sb_out.r0 = sc0;\n",
             &local_764);
  value_ = makeValueFloat64(2.75);
  OffsetValue::OffsetValue(&local_778,8,0,value_);
  makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
            ((vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
              *)((long)&defs[4].mainCode.field_2 + 8),&local_778);
  defs[4].expectedValues.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
  std::allocator<char>::~allocator(&local_764);
  std::allocator<char>::~allocator(&local_763);
  std::allocator<char>::~allocator(&local_762);
  SpecConstant::~SpecConstant(&local_740);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  std::allocator<char>::~allocator(&local_705);
  std::allocator<char>::~allocator(&local_6e4);
  std::allocator<char>::~allocator(&local_6e3);
  std::allocator<char>::~allocator(&local_6e2);
  SpecConstant::~SpecConstant(&local_6c0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::allocator<char>::~allocator(&local_685);
  std::allocator<char>::~allocator(&local_664);
  std::allocator<char>::~allocator(&local_663);
  std::allocator<char>::~allocator(&local_662);
  SpecConstant::~SpecConstant(&local_640);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator(&local_661);
  std::allocator<char>::~allocator(&local_605);
  std::allocator<char>::~allocator(&local_5cc);
  std::allocator<char>::~allocator(&local_5cb);
  std::allocator<char>::~allocator(&local_5ca);
  SpecConstant::~SpecConstant(&local_5a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  SpecConstant::~SpecConstant(&local_548);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::allocator<char>::~allocator(&local_50d);
  std::allocator<char>::~allocator(&local_4d4);
  std::allocator<char>::~allocator(&local_4d3);
  std::allocator<char>::~allocator(&local_4d2);
  SpecConstant::~SpecConstant(&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  SpecConstant::~SpecConstant(&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  std::allocator<char>::~allocator(&local_411);
  for (local_78c = 0; local_78c < 5; local_78c = local_78c + 1) {
    this = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_30)->super_TestNode;
    this_00 = (SpecConstantTest *)operator_new(0x138);
    SpecConstantTest::SpecConstantTest
              (this_00,testCtx,
               testGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               _12_4_,(CaseDefinition *)&defs[(long)local_78c + -1].requirements);
    tcu::TestNode::addChild(this,(TestNode *)this_00);
  }
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_30)
  ;
  local_9e0 = (CaseDefinition *)&defs[4].requirements;
  do {
    local_9e0 = local_9e0 + -1;
    CaseDefinition::~CaseDefinition(local_9e0);
  } while (local_9e0 != (CaseDefinition *)local_408);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_30);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createDefaultValueTests (tcu::TestContext& testCtx, const VkShaderStageFlagBits shaderStage)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup (new tcu::TestCaseGroup(testCtx, "default_value", "use default constant value"));

	const CaseDefinition defs[] =
	{
		{
			"bool",
			makeVector(SpecConstant(1u, "layout(constant_id = ${ID}) const bool sc0 = true;"),
					   SpecConstant(2u, "layout(constant_id = ${ID}) const bool sc1 = false;")),
			8,
			"    bool r0;\n"
			"    bool r1;\n",
			"",
			"    sb_out.r0 = sc0;\n"
			"    sb_out.r1 = sc1;\n",
			makeVector(OffsetValue(4, 0, makeValueBool32(true)),
					   OffsetValue(4, 4, makeValueBool32(false))),
			(FeatureFlags)0,
		},
		{
			"int",
			makeVector(SpecConstant(1u, "layout(constant_id = ${ID}) const int sc0 = -3;"),
					   SpecConstant(2u, "layout(constant_id = ${ID}) const int sc1 = 17;")),
			8,
			"    int r0;\n"
			"    int r1;\n",
			"",
			"    sb_out.r0 = sc0;\n"
			"    sb_out.r1 = sc1;\n",
			makeVector(OffsetValue(4, 0, makeValueInt32(-3)),
					   OffsetValue(4, 4, makeValueInt32(17))),
			(FeatureFlags)0,
		},
		{
			"uint",
			makeVector(SpecConstant(1u, "layout(constant_id = ${ID}) const uint sc0 = 42u;")),
			4,
			"    uint r0;\n",
			"",
			"    sb_out.r0 = sc0;\n",
			makeVector(OffsetValue(4, 0, makeValueUint32(42u))),
			(FeatureFlags)0,
		},
		{
			"float",
			makeVector(SpecConstant(1u, "layout(constant_id = ${ID}) const float sc0 = 7.5;")),
			4,
			"    float r0;\n",
			"",
			"    sb_out.r0 = sc0;\n",
			makeVector(OffsetValue(4, 0, makeValueFloat32(7.5f))),
			(FeatureFlags)0,
		},
		{
			"double",
			makeVector(SpecConstant(1u, "layout(constant_id = ${ID}) const double sc0 = 2.75LF;")),
			8,
			"    double r0;\n",
			"",
			"    sb_out.r0 = sc0;\n",
			makeVector(OffsetValue(8, 0, makeValueFloat64(2.75))),
			FEATURE_SHADER_FLOAT_64,
		},
	};

	for (int defNdx = 0; defNdx < DE_LENGTH_OF_ARRAY(defs); ++defNdx)
		testGroup->addChild(new SpecConstantTest(testCtx, shaderStage, defs[defNdx]));

	return testGroup.release();
}